

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreDisassembler.c
# Opt level: O1

DecodeStatus DecodeL4RSrcDstSrcDstInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  undefined8 in_RAX;
  uint RegNo;
  uint unaff_R12D;
  uint unaff_R13D;
  undefined4 local_34;
  
  local_34 = (uint)((ulong)in_RAX >> 0x20);
  uVar1 = Insn >> 6 & 0x1f;
  if (uVar1 < 0x1b) {
    unaff_R13D = (Insn >> 4 & 3) + (uVar1 % 3) * 4;
    local_34 = (Insn >> 2 & 3) + (uVar1 / 3 + (uVar1 / 9) * -3) * 4;
    Decoder = (void *)(ulong)local_34;
    unaff_R12D = (Insn & 3) + (uVar1 / 9) * 4;
    DVar2 = MCDisassembler_Success;
  }
  else {
    DVar2 = MCDisassembler_Fail;
  }
  RegNo = Insn >> 0x10 & 0xf;
  if (uVar1 < 0x1b) {
    DecodeGRRegsRegisterClass(Inst,unaff_R13D,Address,Decoder);
    DVar2 = DecodeGRRegsRegisterClass(Inst,RegNo,Address,Decoder);
  }
  if (DVar2 == MCDisassembler_Success) {
    DecodeGRRegsRegisterClass(Inst,unaff_R13D,Address,Decoder);
    DecodeGRRegsRegisterClass(Inst,RegNo,Address,Decoder);
    DecodeGRRegsRegisterClass(Inst,local_34,Address,Decoder);
    DecodeGRRegsRegisterClass(Inst,unaff_R12D,Address,Decoder);
  }
  return DVar2;
}

Assistant:

static DecodeStatus DecodeL4RSrcDstSrcDstInstruction(MCInst *Inst, unsigned Insn, uint64_t Address,
		const void *Decoder)
{
	unsigned Op1, Op2, Op3;
	unsigned Op4 = fieldFromInstruction_4(Insn, 16, 4);
	DecodeStatus S =
		Decode3OpInstruction(fieldFromInstruction_4(Insn, 0, 16), &Op1, &Op2, &Op3);
	if (S == MCDisassembler_Success) {
		DecodeGRRegsRegisterClass(Inst, Op1, Address, Decoder);
		S = DecodeGRRegsRegisterClass(Inst, Op4, Address, Decoder);
	}

	if (S == MCDisassembler_Success) {
		DecodeGRRegsRegisterClass(Inst, Op1, Address, Decoder);
		DecodeGRRegsRegisterClass(Inst, Op4, Address, Decoder);
		DecodeGRRegsRegisterClass(Inst, Op2, Address, Decoder);
		DecodeGRRegsRegisterClass(Inst, Op3, Address, Decoder);
	}

	return S;
}